

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O2

bool s2textformat::MakeCellUnion(string_view str,S2CellUnion *cell_union)

{
  size_type sVar1;
  size_type extraout_RDX_00;
  char in_R8B;
  string_view *cell_str;
  S2Region SVar2;
  string_view str_00;
  string_view str_01;
  vector<S2CellId,_std::allocator<S2CellId>_> cell_ids;
  S2CellId cell_id;
  S2CellUnion local_68;
  _Vector_base<S2CellId,_std::allocator<S2CellId>_> local_48;
  size_type extraout_RDX;
  
  cell_ids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  cell_ids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  cell_ids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  str_01.length_ = 0x2c;
  str_01.ptr_ = (char *)str.length_;
  SplitString((vector<absl::string_view,_std::allocator<absl::string_view>_> *)&local_68,
              (s2textformat *)str.ptr_,str_01,in_R8B);
  sVar1 = extraout_RDX;
  SVar2._vptr_S2Region = local_68.super_S2Region._vptr_S2Region;
  do {
    if ((pointer)SVar2._vptr_S2Region ==
        local_68.cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::_Vector_base<absl::string_view,_std::allocator<absl::string_view>_>::~_Vector_base
                ((_Vector_base<absl::string_view,_std::allocator<absl::string_view>_> *)&local_68);
      local_48._M_impl.super__Vector_impl_data._M_start =
           cell_ids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_48._M_impl.super__Vector_impl_data._M_finish =
           cell_ids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
           cell_ids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      cell_ids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      cell_ids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      cell_ids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      S2CellUnion::S2CellUnion(&local_68,(vector<S2CellId,_std::allocator<S2CellId>_> *)&local_48);
      std::vector<S2CellId,_std::allocator<S2CellId>_>::_M_move_assign
                (&cell_union->cell_ids_,&local_68.cell_ids_);
      std::_Vector_base<S2CellId,_std::allocator<S2CellId>_>::~_Vector_base
                (&local_68.cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>);
      std::_Vector_base<S2CellId,_std::allocator<S2CellId>_>::~_Vector_base(&local_48);
LAB_00262423:
      std::_Vector_base<S2CellId,_std::allocator<S2CellId>_>::~_Vector_base
                (&cell_ids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>);
      return (pointer)SVar2._vptr_S2Region ==
             local_68.cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
             super__Vector_impl_data._M_start;
    }
    cell_id.id_ = 0;
    str_00.length_ = sVar1;
    str_00.ptr_ = (char *)((pointer)SVar2._vptr_S2Region)[1].id_;
    cell_id = S2CellId::FromDebugString((S2CellId *)((pointer)SVar2._vptr_S2Region)->id_,str_00);
    if (cell_id.id_ == 0) {
      std::_Vector_base<absl::string_view,_std::allocator<absl::string_view>_>::~_Vector_base
                ((_Vector_base<absl::string_view,_std::allocator<absl::string_view>_> *)&local_68);
      goto LAB_00262423;
    }
    std::vector<S2CellId,_std::allocator<S2CellId>_>::push_back(&cell_ids,&cell_id);
    SVar2._vptr_S2Region = SVar2._vptr_S2Region + 2;
    sVar1 = extraout_RDX_00;
  } while( true );
}

Assistant:

bool MakeCellUnion(string_view str, S2CellUnion* cell_union) {
  vector<S2CellId> cell_ids;
  for (const auto& cell_str : SplitString(str, ',')) {
    S2CellId cell_id;
    if (!MakeCellId(cell_str, &cell_id)) return false;
    cell_ids.push_back(cell_id);
  }
  *cell_union = S2CellUnion(std::move(cell_ids));
  return true;
}